

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter>
Catch::addReporter(Ptr<Catch::IStreamingReporter> *existingReporter,
                  Ptr<Catch::IStreamingReporter> *additionalReporter)

{
  int iVar1;
  type tVar2;
  IStreamingReporter *pIVar3;
  undefined4 extraout_var;
  Ptr<Catch::IStreamingReporter> *in_RSI;
  Ptr<Catch::IStreamingReporter> *in_RDI;
  MultipleReporters *multi;
  Ptr<Catch::IStreamingReporter> *resultingReporter;
  Ptr<Catch::IStreamingReporter> *in_stack_ffffffffffffff88;
  MultipleReporters *in_stack_ffffffffffffff90;
  Ptr<Catch::IStreamingReporter> *this;
  
  this = in_RDI;
  Ptr<Catch::IStreamingReporter>::Ptr(in_RDI);
  tVar2 = Ptr::operator_cast_to_function_pointer((Ptr<Catch::IStreamingReporter> *)0x184214);
  if (tVar2 == 0) {
    Ptr<Catch::IStreamingReporter>::operator=(this,in_RDI);
  }
  else {
    pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(in_RSI);
    iVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0x11])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      in_stack_ffffffffffffff90 = (MultipleReporters *)operator_new(0x28);
      MultipleReporters::MultipleReporters(in_stack_ffffffffffffff90);
      Ptr<Catch::IStreamingReporter>::Ptr
                ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff90,
                 (IStreamingReporter *)in_stack_ffffffffffffff88);
      Ptr<Catch::IStreamingReporter>::operator=(this,in_RDI);
      Ptr<Catch::IStreamingReporter>::~Ptr
                ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff88 =
           (Ptr<Catch::IStreamingReporter> *)
           Ptr::operator_cast_to_function_pointer((Ptr<Catch::IStreamingReporter> *)0x1842c6);
      if (in_stack_ffffffffffffff88 != (Ptr<Catch::IStreamingReporter> *)0x0) {
        MultipleReporters::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    else {
      Ptr<Catch::IStreamingReporter>::operator=(this,in_RDI);
    }
    MultipleReporters::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addReporter( Ptr<IStreamingReporter> const& existingReporter, Ptr<IStreamingReporter> const& additionalReporter ) {
    Ptr<IStreamingReporter> resultingReporter;

    if( existingReporter ) {
        MultipleReporters* multi = existingReporter->tryAsMulti();
        if( !multi ) {
            multi = new MultipleReporters;
            resultingReporter = Ptr<IStreamingReporter>( multi );
            if( existingReporter )
                multi->add( existingReporter );
        }
        else
            resultingReporter = existingReporter;
        multi->add( additionalReporter );
    }
    else
        resultingReporter = additionalReporter;

    return resultingReporter;
}